

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O3

void act_new(char *format,CHAR_DATA *ch,void *arg1,void *arg2,int type,int min_pos)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  ROOM_INDEX_DATA *pRVar8;
  char cVar9;
  char cVar10;
  char **ppcVar11;
  char *pcVar12;
  char *pcVar13;
  CHAR_DATA *ch_00;
  size_t sVar14;
  CHAR_DATA *ch_01;
  int iVar15;
  char *pcVar16;
  ulong uVar17;
  string_view fmt;
  string_view fmt_00;
  char buf2 [100];
  char buf [4608];
  char fname [4608];
  char *local_24c0;
  ulong local_24b8;
  CLogger *local_24b0;
  char local_24a8 [112];
  char local_2438;
  char acStack_2437 [3];
  undefined4 local_2434;
  char local_1238 [4616];
  
  if (format == (char *)0x0) {
    return;
  }
  if (ch == (CHAR_DATA *)0x0) {
    return;
  }
  if (*format == '\0') {
    return;
  }
  pRVar8 = ch->in_room;
  if (pRVar8 == (ROOM_INDEX_DATA *)0x0) {
    return;
  }
  uVar17 = (ulong)(uint)type;
  local_24c0 = format;
  if (type == 2) {
    if (arg2 == (void *)0x0) {
      fmt_00._M_str = "Act: null vch with TO_VICT. -- {}";
      fmt_00._M_len = 0x21;
      CLogger::Warn<char_const*&>((CLogger *)&RS.field_0x140,fmt_00,&local_24c0);
      return;
    }
    pRVar8 = *(ROOM_INDEX_DATA **)((long)arg2 + 0xa8);
    if (pRVar8 == (ROOM_INDEX_DATA *)0x0) {
      return;
    }
  }
  ch_00 = pRVar8->people;
  if (ch_00 != (CHAR_DATA *)0x0) {
    uVar7 = type & 0xfffffffe;
    local_24b0 = (CLogger *)&RS.field_0x140;
    local_24b8 = uVar17;
    do {
      bVar5 = is_npc(ch_00);
      if ((((bVar5) || (ch_00->desc != (DESCRIPTOR_DATA *)0x0)) && (min_pos <= ch_00->position)) &&
         ((iVar15 = (int)uVar17, iVar15 != 3 || (ch_00 == ch)))) {
        if (iVar15 == 2) {
          bVar5 = ch_00 != (CHAR_DATA *)arg2;
LAB_00279ce9:
          if (!(bool)(bVar5 | ch_00 == ch)) {
LAB_00279cf1:
            pcVar13 = &local_2438;
            pcVar16 = local_24c0;
LAB_00279cfe:
            while (cVar10 = *pcVar16, cVar10 == '$') {
              cVar10 = pcVar16[1];
              if ((arg2 == (void *)0x0) && (cVar10 != 'I' && 0xe5 < (byte)(cVar10 + 0xa5U))) {
                sVar14 = 0x1e;
                pcVar12 = "Act: missing arg2 for code {}.";
LAB_00279dca:
                fmt._M_str = pcVar12;
                fmt._M_len = sVar14;
                CLogger::Warn<char_const&>(local_24b0,fmt,pcVar16 + 1);
                pcVar12 = " <@@@> ";
                goto switchD_00279d56_caseD_74;
              }
              pcVar12 = (char *)arg1;
              switch(cVar10) {
              case 'd':
                pcVar12 = "door";
                if ((arg2 != (void *)0x0) && (pcVar12 = "door", *arg2 != '\0')) {
                  pcVar12 = local_1238;
                  one_argument((char *)arg2,pcVar12);
                }
                break;
              case 'e':
                uVar1 = ch->sex;
LAB_00279ecb:
                if (1 < (short)uVar1) {
                  uVar1 = 2;
                }
                if ((short)uVar1 < 1) {
                  uVar1 = 0;
                }
                uVar17 = (ulong)uVar1;
                ppcVar11 = act_area::he_she;
                goto LAB_00279fc2;
              case 'f':
                pcVar12 = ch->true_name;
                if (pcVar12 == (char *)0x0) {
                  pcVar12 = ch->name;
                }
                break;
              case 'g':
              case 'h':
              case 'j':
              case 'k':
              case 'l':
              case 'o':
              case 'q':
              case 'r':
switchD_00279d56_caseD_67:
                sVar14 = 0x11;
                pcVar12 = "Act: bad code {}.";
                goto LAB_00279dca;
              case 'i':
                uVar4 = *arg1;
LAB_00279fcb:
                pcVar12 = local_24a8;
                sprintf(pcVar12,"%d",(ulong)uVar4);
                break;
              case 'm':
                uVar2 = ch->sex;
LAB_00279f77:
                if (1 < (short)uVar2) {
                  uVar2 = 2;
                }
                if ((short)uVar2 < 1) {
                  uVar2 = 0;
                }
                uVar17 = (ulong)uVar2;
                ppcVar11 = act_area::him_her;
                goto LAB_00279fc2;
              case 'n':
                ch_01 = ch;
LAB_00279fe6:
                pcVar12 = get_descr_form(ch_01,ch_00,false);
                break;
              case 'p':
                pcVar12 = "something";
                if (arg1 != (void *)0x0) {
                  bVar5 = can_see_obj(ch_00,(OBJ_DATA *)arg1);
                  pcVar12 = "something";
                  if (bVar5) {
                    pcVar12 = *(char **)((long)arg1 + 0x88);
                  }
                  uVar17 = (long)(pcVar16 + 1) - (long)local_24c0;
                  if ((3 < (long)uVar17) &&
                     (((pcVar16[-3] == '\'' && (pcVar16[-2] == 's')) ||
                      ((5 < uVar17 &&
                       ((pcVar16[-3] == 'u' && pcVar16[-4] == 'o' && (pcVar16[-2] == 'r')))))))) {
                    bVar5 = str_prefix("the ",pcVar12);
                    bVar6 = str_prefix("a ",pcVar12 + (ulong)!bVar5 * 4);
                    pcVar12 = pcVar12 + (ulong)!bVar5 * 4 + (ulong)!bVar6 * 2;
                  }
                }
                break;
              case 's':
                uVar3 = ch->sex;
LAB_00279fa1:
                if (1 < (short)uVar3) {
                  uVar3 = 2;
                }
                if ((short)uVar3 < 1) {
                  uVar3 = 0;
                }
                uVar17 = (ulong)uVar3;
                ppcVar11 = act_area::his_her;
LAB_00279fc2:
                pcVar12 = ppcVar11[uVar17];
                break;
              case 't':
                break;
              default:
                switch(cVar10) {
                case 'E':
                  uVar1 = (ushort)*(undefined4 *)((long)arg2 + 0x134);
                  goto LAB_00279ecb;
                case 'F':
                  pcVar12 = *(char **)((long)arg2 + 0xf0);
                  if (pcVar12 == (char *)0x0) {
                    pcVar12 = *(char **)((long)arg2 + 0xe8);
                  }
                  break;
                default:
                  goto switchD_00279d56_caseD_67;
                case 'I':
                  uVar4 = *arg2;
                  goto LAB_00279fcb;
                case 'M':
                  uVar2 = (ushort)*(undefined4 *)((long)arg2 + 0x134);
                  goto LAB_00279f77;
                case 'N':
                  ch_01 = (CHAR_DATA *)arg2;
                  goto LAB_00279fe6;
                case 'P':
                  bVar5 = can_see_obj(ch_00,(OBJ_DATA *)arg2);
                  pcVar12 = "something";
                  if (bVar5) {
                    pcVar12 = *(char **)((long)arg2 + 0x88);
                  }
                  break;
                case 'S':
                  uVar3 = (ushort)*(undefined4 *)((long)arg2 + 0x134);
                  goto LAB_00279fa1;
                case 'T':
                  pcVar12 = (char *)arg2;
                }
              }
switchD_00279d56_caseD_74:
              pcVar16 = pcVar16 + 2;
              cVar10 = *pcVar12;
              *pcVar13 = cVar10;
              while (cVar10 != '\0') {
                pcVar12 = pcVar12 + 1;
                cVar10 = *pcVar12;
                pcVar13[1] = cVar10;
                pcVar13 = pcVar13 + 1;
              }
            }
            if (cVar10 != '\0') {
              pcVar16 = pcVar16 + 1;
              *pcVar13 = cVar10;
              pcVar13 = pcVar13 + 1;
              goto LAB_00279cfe;
            }
            pcVar13[0] = '\n';
            pcVar13[1] = '\r';
            pcVar13[2] = '\0';
            bVar5 = str_prefix("\x1b[0m",&local_2438);
            if (bVar5) {
              bVar5 = str_prefix("\x1b",&local_2438);
              if (bVar5) {
                cVar10 = (char)_local_2438;
                cVar9 = cVar10 + -0x20;
                if (0x19 < (byte)(cVar10 + 0x9fU)) {
                  cVar9 = cVar10;
                }
                _local_2438 = CONCAT31(acStack_2437,cVar9);
              }
              else {
                cVar10 = local_2434._3_1_ + -0x20;
                if (0x19 < (byte)(local_2434._3_1_ + 0x9fU)) {
                  cVar10 = local_2434._3_1_;
                }
                local_2434 = CONCAT13(cVar10,(undefined3)local_2434);
              }
            }
            else {
              cVar10 = (char)local_2434;
              cVar9 = cVar10 + -0x20;
              if (0x19 < (byte)(cVar10 + 0x9fU)) {
                cVar9 = cVar10;
              }
              local_2434 = CONCAT31(local_2434._1_3_,cVar9);
            }
            uVar17 = local_24b8;
            if (ch_00->desc != (DESCRIPTOR_DATA *)0x0) {
              write_to_buffer(ch_00->desc,&local_2438,((int)pcVar13 + 2) - (int)&local_2438);
            }
          }
        }
        else if ((iVar15 != 0) || (ch_00 != ch)) {
          switch(iVar15) {
          case 1:
            bVar5 = ch_00 == (CHAR_DATA *)arg2;
            goto LAB_00279ce9;
          default:
            if ((uVar7 != 6) || (ch_00 != ch)) goto LAB_00279cf1;
            break;
          case 5:
            bVar5 = is_immortal(ch_00);
            if ((ch_00 != ch) && (bVar5)) {
              bVar5 = can_see(ch_00,ch);
LAB_0027a180:
              if (bVar5 != false) goto LAB_00279cf1;
            }
            break;
          case 6:
            bVar5 = is_same_group(ch_00,ch);
            if (uVar7 != 6 || ch_00 != ch) goto LAB_0027a180;
            break;
          case 7:
            bVar5 = is_same_group(ch_00,ch);
            if ((!bVar5) && (uVar7 != 6 || ch_00 != ch)) goto LAB_00279cf1;
          }
        }
      }
      ch_00 = ch_00->next_in_room;
    } while (ch_00 != (CHAR_DATA *)0x0);
  }
  return;
}

Assistant:

void act_new(const char *format, CHAR_DATA *ch, const void *arg1, const void *arg2, int type, int min_pos)
{
	static char *const he_she[] = {"it", "he", "she"};
	static char *const him_her[] = {"it", "him", "her"};
	static char *const his_her[] = {"its", "his", "her"};

	char buf[MAX_STRING_LENGTH], buf2[100];
	char fname[MAX_INPUT_LENGTH];
	CHAR_DATA *to;
	CHAR_DATA *vch = (CHAR_DATA *)arg2;
	OBJ_DATA *obj1 = (OBJ_DATA *)arg1;
	OBJ_DATA *obj2 = (OBJ_DATA *)arg2;
	const char *str;
	const char *i;
	char *point;

	/*
	 * Discard null and zero-length messages.
	 */
	if (format == nullptr || format[0] == '\0')
		return;

	/* discard null rooms and chars */
	if (ch == nullptr || ch->in_room == nullptr)
		return;

	/*colorconv(format, format, ch);*/
	to = ch->in_room->people;

	if (type == TO_VICT)
	{
		if (vch == nullptr)
		{
			RS.Logger.Warn("Act: null vch with TO_VICT. -- {}", format);
			return;
		}

		if (vch->in_room == nullptr)
			return;

		to = vch->in_room->people;
	}

	for (; to != nullptr; to = to->next_in_room)
	{
		if ((!is_npc(to) && to->desc == nullptr) || to->position < min_pos)
			continue;

		if ((type == TO_CHAR) && to != ch)
			continue;

		if (type == TO_VICT && (to != vch || to == ch))
			continue;

		if (type == TO_ROOM && to == ch)
			continue;

		if (type == TO_NOTVICT && (to == ch || to == vch))
			continue;

		if (type == TO_IMMINROOM && (!(is_immortal(to)) || (to == ch) || !(can_see(to, ch))))
			continue;

		if (type == TO_GROUP && !is_same_group(to, ch))
			continue;

		if (type == TO_NOTGROUP && is_same_group(to, ch))
			continue;

		if ((type == TO_GROUP || type == TO_NOTGROUP) && to == ch)
			continue;

		point = buf;
		str = format;

		while (*str != '\0')
		{
			if (*str != '$')
			{
				*point++ = *str++;
				continue;
			}

			++str;

			if (arg2 == nullptr && *str >= 'A' && *str <= 'Z' && *str != 'I')
			{
				RS.Logger.Warn("Act: missing arg2 for code {}.", *str);
				i = " <@@@> ";
			}
			else
			{
				switch (*str)
				{
					/* Thx alex for 't' idea */
					case 't':
						i = (char *)arg1;
						break;
					case 'T':
						i = (char *)arg2;
						break;
					case 'n':
						i = get_descr_form(ch, to, false);
						break;
					case 'N':
						i = get_descr_form(vch, to, false);
						break;
					case 'f':
						i = (ch->true_name ? ch->true_name : ch->name);
						break;
					case 'F':
						i = (vch->true_name ? vch->true_name : vch->name);
						break;
					case 'i':
						sprintf(buf2, "%d", *((int *)arg1));
						i = (const char *)&buf2;
						break;
					case 'I':
						sprintf(buf2, "%d", *((int *)arg2));
						i = (const char *)&buf2;
						break;
					case 'e':
						i = he_she[URANGE(0, ch->sex, 2)];
						break;
					case 'E':
						i = he_she[URANGE(0, vch->sex, 2)];
						break;
					case 'm':
						i = him_her[URANGE(0, ch->sex, 2)];
						break;
					case 'M':
						i = him_her[URANGE(0, vch->sex, 2)];
						break;
					case 's':
						i = his_her[URANGE(0, ch->sex, 2)];
						break;
					case 'S':
						i = his_her[URANGE(0, vch->sex, 2)];
						break;
					case 'p':
						if (obj1 == nullptr)
						{
							i = "something";
							break;
						}

						i = can_see_obj(to, obj1) ? obj1->short_descr : "something";

						// obj article truncation: back up 2-don't truncate the/a from obj short descr unless it's preceded
						// by Your or 's
						if (((str - format) >= 4 && *(str - 4) == '\'' && *(str - 3) == 's')
							|| ((str - format) >= 6 && *(str - 5) == 'o' && *(str - 4) == 'u' && *(str - 3) == 'r'))
						{
							if (!str_prefix("the ", i))
								i += 4;

							if (!str_prefix("a ", i))
								i += 2;
						}

						break;
					case 'P':
						i = can_see_obj(to, obj2) ? obj2->short_descr : "something";
						break;
					case 'd':
						if (arg2 == nullptr || ((char *)arg2)[0] == '\0')
						{
							i = "door";
						}
						else
						{
							one_argument((char *)arg2, fname);
							i = fname;
						}
						break;
					default:
						RS.Logger.Warn("Act: bad code {}.", *str);
						i = " <@@@> ";
						break;
				}
			}

			++str;

			while ((*point = *i) != '\0')
			{
				++point, ++i;
			}
		}

		*point++ = '\n';
		*point++ = '\r';
		*point = '\0';

		if (!str_prefix("\x01B[0m", buf))
			buf[4] = UPPER(buf[4]);
		else if (!str_prefix("\x01B", buf))
			buf[7] = UPPER(buf[7]);
		else
			buf[0] = UPPER(buf[0]);

		if (to->desc != nullptr)
			write_to_buffer(to->desc, buf, point - buf);
	}
}